

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_registerSequenceProducer(ZSTD_CCtx *zc,void *mState,ZSTD_sequenceProducer_F *mFinder)

{
  long in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  ZSTD_externalMatchCtx emctx;
  
  if (in_RDX == 0) {
    memset((void *)(in_RDI + 0x1458),0,0x20);
    *(undefined4 *)(in_RDI + 200) = 0;
  }
  else {
    *(undefined8 *)(in_RDI + 0x1458) = in_RSI;
    *(long *)(in_RDI + 0x1460) = in_RDX;
    *(undefined8 *)(in_RDI + 0x1468) = 0;
    *(undefined8 *)(in_RDI + 0x1470) = 0;
    *(undefined4 *)(in_RDI + 200) = 1;
  }
  return;
}

Assistant:

void ZSTD_registerSequenceProducer(
    ZSTD_CCtx* zc, void* mState,
    ZSTD_sequenceProducer_F* mFinder
) {
    if (mFinder != NULL) {
        ZSTD_externalMatchCtx emctx;
        emctx.mState = mState;
        emctx.mFinder = mFinder;
        emctx.seqBuffer = NULL;
        emctx.seqBufferCapacity = 0;
        zc->externalMatchCtx = emctx;
        zc->requestedParams.useSequenceProducer = 1;
    } else {
        ZSTD_memset(&zc->externalMatchCtx, 0, sizeof(zc->externalMatchCtx));
        zc->requestedParams.useSequenceProducer = 0;
    }
}